

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O2

optional<pbrt::ShapeSample> * __thiscall
pbrt::ShapeHandle::Sample
          (optional<pbrt::ShapeSample> *__return_storage_ptr__,ShapeHandle *this,
          ShapeSampleContext *ctx,Point2f u)

{
  undefined1 auVar1 [16];
  undefined8 in_XMM0_Qb;
  anon_class_16_2_de2e2957 func;
  Tuple2<pbrt::Point2,_float> local_10;
  
  auVar1._8_8_ = in_XMM0_Qb;
  auVar1._0_8_ = u.super_Tuple2<pbrt::Point2,_float>;
  local_10 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar1);
  func.u = (Point2f *)&local_10;
  func.ctx = ctx;
  TaggedPointer<pbrt::Sphere,pbrt::Cylinder,pbrt::Disk,pbrt::Triangle,pbrt::BilinearPatch,pbrt::Curve>
  ::
  Dispatch<pbrt::ShapeHandle::Sample(pbrt::ShapeSampleContext_const&,pbrt::Point2<float>)const::_lambda(auto:1)_1_>
            (__return_storage_ptr__,
             (TaggedPointer<pbrt::Sphere,pbrt::Cylinder,pbrt::Disk,pbrt::Triangle,pbrt::BilinearPatch,pbrt::Curve>
              *)this,func);
  return __return_storage_ptr__;
}

Assistant:

inline pstd::optional<ShapeSample> ShapeHandle::Sample(const ShapeSampleContext &ctx,
                                                       Point2f u) const {
    auto sample = [&](auto ptr) { return ptr->Sample(ctx, u); };
    return Dispatch(sample);
}